

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBMultiplyRow_AVX2(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  bool bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  
  do {
    auVar1 = *(undefined1 (*) [32])src_argb0;
    src_argb0 = (uint8_t *)((long)src_argb0 + 0x20);
    auVar2 = *(undefined1 (*) [32])src_argb1;
    src_argb1 = (uint8_t *)((long)src_argb1 + 0x20);
    auVar5 = vpunpcklbw_avx2(auVar1,auVar1);
    auVar4 = vpunpckhbw_avx2(auVar1,auVar1);
    auVar1 = vpunpcklbw_avx2(auVar2,(undefined1  [32])0x0);
    auVar2 = vpunpckhbw_avx2(auVar2,(undefined1  [32])0x0);
    auVar1 = vpmulhuw_avx2(auVar5,auVar1);
    auVar2 = vpmulhuw_avx2(auVar4,auVar2);
    auVar1 = vpackuswb_avx2(auVar1,auVar2);
    *(undefined1 (*) [32])dst_argb = auVar1;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar6 = width + -8;
    bVar3 = 7 < width;
    width = iVar6;
  } while (iVar6 != 0 && bVar3);
  return;
}

Assistant:

void ARGBMultiplyRow_AVX2(const uint8_t* src_argb0,
                          const uint8_t* src_argb1,
                          uint8_t* dst_argb,
                          int width) {
  asm volatile(

      "vpxor       %%ymm5,%%ymm5,%%ymm5          \n"

      // 4 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm1                   \n"
      "lea         0x20(%0),%0                   \n"
      "vmovdqu     (%1),%%ymm3                   \n"
      "lea         0x20(%1),%1                   \n"
      "vpunpcklbw  %%ymm1,%%ymm1,%%ymm0          \n"
      "vpunpckhbw  %%ymm1,%%ymm1,%%ymm1          \n"
      "vpunpcklbw  %%ymm5,%%ymm3,%%ymm2          \n"
      "vpunpckhbw  %%ymm5,%%ymm3,%%ymm3          \n"
      "vpmulhuw    %%ymm2,%%ymm0,%%ymm0          \n"
      "vpmulhuw    %%ymm3,%%ymm1,%%ymm1          \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"
      "vmovdqu     %%ymm0,(%2)                   \n"
      "lea         0x20(%2),%2                   \n"
      "sub         $0x8,%3                       \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_argb0),  // %0
        "+r"(src_argb1),  // %1
        "+r"(dst_argb),   // %2
        "+r"(width)       // %3
      :
      : "memory", "cc"
#if defined(__AVX2__)
        ,
        "xmm0", "xmm1", "xmm2", "xmm3", "xmm5"
#endif
  );
}